

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

bool __thiscall xLearn::InmemReader::hash_binary(InmemReader *this,string *filename)

{
  uint64 uVar1;
  bool bVar2;
  FILE *file;
  uint64_t uVar3;
  uint64 hash_2;
  uint64 hash_1;
  string bin_file;
  
  std::operator+(&bin_file,filename,".bin");
  bVar2 = FileExist(bin_file._M_dataplus._M_p);
  if (bVar2) {
    file = OpenFileOrDie(bin_file._M_dataplus._M_p,"r");
    hash_1 = 0;
    ReadDataFromDisk(file,(char *)&hash_1,8);
    uVar1 = hash_1;
    uVar3 = HashFile(filename,true);
    if (uVar1 == uVar3) {
      hash_2 = 0;
      ReadDataFromDisk(file,(char *)&hash_2,8);
      uVar1 = hash_2;
      uVar3 = HashFile(filename,false);
      Close(file);
      bVar2 = uVar1 == uVar3;
      goto LAB_001296f4;
    }
    Close(file);
  }
  bVar2 = false;
LAB_001296f4:
  std::__cxx11::string::~string((string *)&bin_file);
  return bVar2;
}

Assistant:

bool InmemReader::hash_binary(const std::string& filename) {
  std::string bin_file = filename + ".bin";
  // If the ".bin" file does not exists, return false.
  if (!FileExist(bin_file.c_str())) { return false; }
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(bin_file.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(bin_file.c_str(), "rb");
#endif
  // Check the first hash value
  uint64 hash_1 = 0;
  ReadDataFromDisk(file, (char*)&hash_1, sizeof(hash_1));
  if (hash_1 != HashFile(filename, true)) {
    Close(file);
    return false;
  }
  // Check the second hash value
  uint64 hash_2 = 0;
  ReadDataFromDisk(file, (char*)&hash_2, sizeof(hash_2));
  if (hash_2 != HashFile(filename, false)) {
    Close(file);
    return false;
  }
  Close(file);
  return true;
}